

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<anurbs::Line<2L>,_std::shared_ptr<anurbs::Line<2L>_>_> * __thiscall
pybind11::class_<anurbs::Line<2l>,std::shared_ptr<anurbs::Line<2l>>>::
def_static<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>(*)(Eigen::Matrix<double,1,2,1,1,2>const&,Eigen::Matrix<double,1,2,1,1,2>const&,Eigen::Matrix<double,1,2,1,1,2>const&,bool),pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg_v>
          (class_<anurbs::Line<2l>,std::shared_ptr<anurbs::Line<2l>>> *this,char *name_,
          _func_pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_Matrix<double,_1,_2,_1,_1,_2>_ptr_Matrix<double,_1,_2,_1,_1,_2>_ptr_Matrix<double,_1,_2,_1,_1,_2>_ptr_bool
          **f,arg *extra,arg *extra_1,arg *extra_2,arg_v *extra_3)

{
  _func_pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_Matrix<double,_1,_2,_1,_1,_2>_ptr_Matrix<double,_1,_2,_1,_1,_2>_ptr_Matrix<double,_1,_2,_1,_1,_2>_ptr_bool
  *f_00;
  handle local_c0;
  PyObject *local_b8;
  obj_attr_accessor local_b0;
  staticmethod local_90 [3];
  handle local_78;
  PyObject *local_70;
  handle local_68;
  handle local_60;
  sibling local_58;
  scope local_50;
  name local_48;
  cpp_function local_40;
  cpp_function cf;
  arg *extra_local_2;
  arg *extra_local_1;
  arg *extra_local;
  _func_pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_Matrix<double,_1,_2,_1,_1,_2>_ptr_Matrix<double,_1,_2,_1,_1,_2>_ptr_Matrix<double,_1,_2,_1,_1,_2>_ptr_bool
  **f_local;
  char *name__local;
  class_<anurbs::Line<2L>,_std::shared_ptr<anurbs::Line<2L>_>_> *this_local;
  
  f_00 = *f;
  cf.super_function.super_object.super_handle.m_ptr = (function)(function)extra_2;
  pybind11::name::name(&local_48,name_);
  pybind11::scope::scope(&local_50,(handle *)this);
  local_68.m_ptr = *(PyObject **)this;
  none::none((none *)&local_78);
  local_70 = local_78.m_ptr;
  getattr((pybind11 *)&local_60,local_68,name_,local_78);
  sibling::sibling(&local_58,&local_60);
  cpp_function::
  cpp_function<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>,Eigen::Matrix<double,1,2,1,1,2>const&,Eigen::Matrix<double,1,2,1,1,2>const&,Eigen::Matrix<double,1,2,1,1,2>const&,bool,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg_v>
            (&local_40,f_00,&local_48,&local_50,&local_58,extra,extra_1,
             (arg *)cf.super_function.super_object.super_handle.m_ptr,extra_3);
  pybind11::object::~object((object *)&local_60);
  none::~none((none *)&local_78);
  staticmethod::staticmethod(local_90,(object *)&local_40);
  cpp_function::name((cpp_function *)&local_c0);
  local_b8 = local_c0.m_ptr;
  detail::object_api<pybind11::handle>::attr
            (&local_b0,(object_api<pybind11::handle> *)this,local_c0);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::operator=(&local_b0,local_90);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor(&local_b0);
  pybind11::object::~object((object *)&local_c0);
  staticmethod::~staticmethod(local_90);
  cpp_function::~cpp_function(&local_40);
  return (class_<anurbs::Line<2L>,_std::shared_ptr<anurbs::Line<2L>_>_> *)this;
}

Assistant:

class_ &
    def_static(const char *name_, Func &&f, const Extra&... extra) {
        static_assert(!std::is_member_function_pointer<Func>::value,
                "def_static(...) called with a non-static member function pointer");
        cpp_function cf(std::forward<Func>(f), name(name_), scope(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = staticmethod(cf);
        return *this;
    }